

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O1

void QDBusPlatformMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QDBusPlatformMenu_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QDBusMenuItemKeys> local_80;
  QArrayDataPointer<QDBusMenuItem> local_68;
  undefined1 local_50 [8];
  QDBusMenuItemKeys *local_48;
  QArrayDataPointer<QDBusMenuItem> *pQStack_40;
  QArrayDataPointer<QDBusMenuItemKeys> *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == IndexOfMethod) {
      plVar1 = (long *)_a[1];
      if (((((code *)*plVar1 == updated) && (uVar3 = 0, plVar1[1] == 0)) ||
          (((code *)*plVar1 == propertiesUpdated && (uVar3 = 1, plVar1[1] == 0)))) ||
         (((code *)*plVar1 == popupRequested && (uVar3 = 2, plVar1[1] == 0)))) {
        *(undefined4 *)*_a = uVar3;
      }
    }
    else if (_c == InvokeMetaMethod) {
      if (_id == 2) {
        local_50._4_4_ = *_a[1];
        local_50._0_4_ = *_a[2];
        iVar5 = 2;
      }
      else {
        if (_id == 1) {
          plVar1 = (long *)_a[1];
          local_68.d = (Data *)*plVar1;
          local_68.ptr = (QDBusMenuItem *)plVar1[1];
          local_68.size = plVar1[2];
          if (local_68.d != (Data *)0x0) {
            LOCK();
            ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          plVar1 = (long *)_a[2];
          local_80.d = (Data *)*plVar1;
          local_80.ptr = (QDBusMenuItemKeys *)plVar1[1];
          local_80.size = plVar1[2];
          if (local_80.d != (Data *)0x0) {
            LOCK();
            ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_48 = (QDBusMenuItemKeys *)0x0;
          pQStack_40 = &local_68;
          local_38 = &local_80;
          QMetaObject::activate(_o,&staticMetaObject,1,&local_48);
          QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer(&local_80);
          QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&local_68);
          goto LAB_0065035f;
        }
        if (_id != 0) goto LAB_0065035f;
        local_50._4_4_ = *_a[1];
        local_50._0_4_ = *_a[2];
        iVar5 = 0;
      }
      local_38 = (QArrayDataPointer<QDBusMenuItemKeys> *)local_50;
      pQStack_40 = (QArrayDataPointer<QDBusMenuItem> *)(local_50 + 4);
      local_48 = (QDBusMenuItemKeys *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_48);
    }
    goto LAB_0065035f;
  }
  if (_id == 1) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
    }
    else {
      if (*_a[1] != 1) goto LAB_006502f9;
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
    }
    *puVar2 = pIVar4;
  }
  else {
    puVar2 = (undefined8 *)*_a;
LAB_006502f9:
    *puVar2 = 0;
  }
LAB_0065035f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusPlatformMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusPlatformMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->propertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->popupRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(uint , int )>(_a, &QDBusPlatformMenu::updated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(QDBusMenuItemList , QDBusMenuItemKeysList )>(_a, &QDBusPlatformMenu::propertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(int , uint )>(_a, &QDBusPlatformMenu::popupRequested, 2))
            return;
    }
}